

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_chmod(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  __uid_t _Var2;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  uv_loop_t *puVar5;
  void *pvVar6;
  char *pcVar7;
  undefined8 *puVar8;
  int **ppiVar9;
  uv_loop_t *puVar10;
  char *pcVar11;
  undefined8 *puVar12;
  char *pcVar13;
  int **unaff_R14;
  int **ppiVar14;
  int **ppiVar15;
  int **ppiVar16;
  int **ppiVar17;
  uv_buf_t uVar18;
  uv_fs_t req;
  undefined1 auStack_b10 [88];
  long lStack_ab8;
  long lStack_ab0;
  code *pcStack_958;
  code *pcStack_950;
  undefined8 uStack_948;
  char acStack_938 [88];
  char *pcStack_8e0;
  uv_loop_t *puStack_780;
  int **ppiStack_778;
  code *pcStack_770;
  code *pcStack_768;
  uv_loop_t *puStack_760;
  code *pcStack_758;
  int *apiStack_750 [11];
  uv_loop_t *puStack_6f8;
  int **ppiStack_598;
  int **ppiStack_590;
  undefined8 uStack_588;
  int *apiStack_578 [11];
  int **ppiStack_520;
  undefined8 *puStack_3c0;
  int **ppiStack_3b8;
  code *pcStack_3b0;
  code *pcStack_3a8;
  undefined1 auStack_398 [88];
  long lStack_340;
  uint uStack_320;
  code *pcStack_1e0;
  undefined8 local_1d8;
  int *local_1d0 [11];
  char *local_178;
  
  pcVar7 = "test_file";
  pcStack_1e0 = (code *)0x154fed;
  unlink("test_file");
  pcStack_1e0 = (code *)0x154ff2;
  loop = (uv_loop_t *)uv_default_loop();
  ppiVar9 = local_1d0;
  puVar3 = (uv_loop_t *)0x0;
  pcStack_1e0 = (code *)0x155016;
  iVar1 = uv_fs_open(0,ppiVar9,"test_file",0x42,0x180,0);
  pcVar11 = local_178;
  if (iVar1 < 0) {
    pcStack_1e0 = (code *)0x1552e9;
    run_test_fs_chmod_cold_1();
LAB_001552e9:
    pcStack_1e0 = (code *)0x1552ee;
    run_test_fs_chmod_cold_2();
LAB_001552ee:
    pcStack_1e0 = (code *)0x1552f3;
    run_test_fs_chmod_cold_3();
LAB_001552f3:
    pcStack_1e0 = (code *)0x1552f8;
    run_test_fs_chmod_cold_4();
LAB_001552f8:
    pcStack_1e0 = (code *)0x1552fd;
    run_test_fs_chmod_cold_5();
LAB_001552fd:
    pcStack_1e0 = (code *)0x155302;
    run_test_fs_chmod_cold_6();
LAB_00155302:
    pcStack_1e0 = (code *)0x155307;
    run_test_fs_chmod_cold_7();
LAB_00155307:
    pcStack_1e0 = (code *)0x15530c;
    run_test_fs_chmod_cold_8();
LAB_0015530c:
    pcStack_1e0 = (code *)0x155311;
    run_test_fs_chmod_cold_9();
LAB_00155311:
    pcStack_1e0 = (code *)0x155316;
    run_test_fs_chmod_cold_10();
LAB_00155316:
    pcStack_1e0 = (code *)0x15531b;
    run_test_fs_chmod_cold_11();
LAB_0015531b:
    pcStack_1e0 = (code *)0x155320;
    run_test_fs_chmod_cold_12();
LAB_00155320:
    pcStack_1e0 = (code *)0x155325;
    run_test_fs_chmod_cold_13();
LAB_00155325:
    pcStack_1e0 = (code *)0x15532a;
    run_test_fs_chmod_cold_14();
LAB_0015532a:
    pcStack_1e0 = (code *)0x15532f;
    run_test_fs_chmod_cold_15();
LAB_0015532f:
    pcStack_1e0 = (code *)0x155334;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar7 = local_178;
    if ((long)local_178 < 0) goto LAB_001552e9;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x155039;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x15504a;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1d8 = 0;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x155080;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)pcVar11 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar11;
    if (iVar1 != 0xd) goto LAB_001552ee;
    if (local_178 != (char *)0xd) goto LAB_001552f3;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x1550a2;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x1550bb;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x80,0);
    if (iVar1 != 0) goto LAB_001552f8;
    if (local_178 != (char *)0x0) goto LAB_001552fd;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x1550dc;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x1550f0;
    check_permission("test_file",0x80);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x155105;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_00155302;
    if (local_178 != (char *)0x0) goto LAB_00155307;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x155126;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x155137;
    check_permission("test_file",0x100);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x15514b;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_fchmod(0,unaff_R14,(ulong)pcVar11 & 0xffffffff,0x180,0);
    if (iVar1 != 0) goto LAB_0015530c;
    if (local_178 != (char *)0x0) goto LAB_00155311;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x15516c;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x155180;
    check_permission("test_file",0x180);
    local_1d0[0] = &run_test_fs_chmod::mode;
    pcStack_1e0 = (code *)0x1551a8;
    ppiVar9 = unaff_R14;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,unaff_R14,"test_file",0x80,chmod_cb);
    if (iVar1 != 0) goto LAB_00155316;
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x1551be;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015531b;
    chmod_cb_count = 0;
    ppiVar9 = local_1d0;
    local_1d0[0] = &run_test_fs_chmod::mode_1;
    pcStack_1e0 = (code *)0x155203;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar9,"test_file",0x100,chmod_cb);
    if (iVar1 != 0) goto LAB_00155320;
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x155219;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155325;
    ppiVar9 = local_1d0;
    local_1d0[0] = &run_test_fs_chmod::mode_2;
    pcStack_1e0 = (code *)0x15524f;
    puVar3 = loop;
    iVar1 = uv_fs_fchmod(loop,ppiVar9,(ulong)pcVar11 & 0xffffffff,0x180,fchmod_cb);
    if (iVar1 != 0) goto LAB_0015532a;
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x155265;
    puVar3 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_0015532f;
    pcStack_1e0 = (code *)0x155287;
    uv_fs_close(loop,local_1d0,(ulong)pcVar11 & 0xffffffff,0);
    pcStack_1e0 = (code *)0x155295;
    uv_run(loop,0);
    pcStack_1e0 = (code *)0x1552a1;
    unlink("test_file");
    pcStack_1e0 = (code *)0x1552a6;
    pcVar7 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x1552ba;
    uv_walk(pcVar7,close_walk_cb,0);
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x1552c4;
    uv_run(pcVar7);
    pcStack_1e0 = (code *)0x1552c9;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_1e0 = (code *)0x1552d1;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_1e0 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar8 = (undefined8 *)((ulong)ppiVar9 & 0xffffffff);
  puVar12 = (undefined8 *)0x0;
  pcStack_3a8 = (code *)0x155354;
  pcStack_1e0 = (code *)pcVar7;
  iVar1 = uv_fs_stat(0,auStack_398,puVar3,0);
  if (iVar1 == 0) {
    if (lStack_340 != 0) goto LAB_00155388;
    if ((uStack_320 & 0x1ff) == (uint)ppiVar9) {
      pcStack_3a8 = (code *)0x15537a;
      iVar1 = uv_fs_req_cleanup(auStack_398);
      return iVar1;
    }
  }
  else {
    pcStack_3a8 = (code *)0x155388;
    check_permission_cold_1();
LAB_00155388:
    pcStack_3a8 = (code *)0x15538d;
    check_permission_cold_2();
  }
  pcStack_3a8 = chmod_cb;
  check_permission_cold_3();
  pcStack_3a8 = (code *)puVar8;
  if (*(int *)(puVar12 + 8) == 0xd) {
    puVar8 = puVar12;
    if (puVar12[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_3b0 = (code *)0x1553b1;
      uv_fs_req_cleanup(puVar12);
      check_permission("test_file",*(uint *)*puVar12);
      return extraout_EAX;
    }
  }
  else {
    pcStack_3b0 = (code *)0x1553c8;
    chmod_cb_cold_1();
  }
  pcStack_3b0 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_3b0 = (code *)puVar8;
  if (*(int *)(puVar12 + 8) == 0xe) {
    puStack_3c0 = puVar12;
    if (puVar12[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      ppiStack_3b8 = (int **)0x1553ec;
      uv_fs_req_cleanup(puVar12);
      check_permission("test_file",*(uint *)*puVar12);
      return extraout_EAX_00;
    }
  }
  else {
    ppiStack_3b8 = (int **)0x155403;
    fchmod_cb_cold_1();
    puStack_3c0 = puVar8;
  }
  ppiStack_3b8 = (int **)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  ppiVar9 = (int **)0x184385;
  ppiStack_590 = (int **)0x155421;
  ppiStack_3b8 = unaff_R14;
  unlink("test_file");
  ppiStack_590 = (int **)0x155426;
  loop = (uv_loop_t *)uv_default_loop();
  ppiStack_590 = (int **)0x15544a;
  iVar1 = uv_fs_open(0,apiStack_578,"test_file",0x42,0x180,0);
  ppiVar17 = ppiStack_520;
  if (iVar1 < 0) {
    ppiStack_590 = (int **)0x1555e7;
    run_test_fs_unlink_readonly_cold_1();
LAB_001555e7:
    ppiStack_590 = (int **)0x1555ec;
    run_test_fs_unlink_readonly_cold_2();
LAB_001555ec:
    ppiStack_590 = (int **)0x1555f1;
    run_test_fs_unlink_readonly_cold_3();
LAB_001555f1:
    ppiStack_590 = (int **)0x1555f6;
    run_test_fs_unlink_readonly_cold_4();
LAB_001555f6:
    ppiStack_590 = (int **)0x1555fb;
    run_test_fs_unlink_readonly_cold_5();
LAB_001555fb:
    ppiStack_590 = (int **)0x155600;
    run_test_fs_unlink_readonly_cold_6();
LAB_00155600:
    ppiStack_590 = (int **)0x155605;
    run_test_fs_unlink_readonly_cold_7();
LAB_00155605:
    ppiStack_590 = (int **)0x15560a;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    ppiVar9 = ppiStack_520;
    if ((long)ppiStack_520 < 0) goto LAB_001555e7;
    unaff_R14 = apiStack_578;
    ppiStack_590 = (int **)0x15546d;
    uv_fs_req_cleanup(unaff_R14);
    ppiStack_590 = (int **)0x15547e;
    uVar18 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_588 = 0;
    ppiStack_590 = (int **)0x1554b4;
    iov = uVar18;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)ppiVar17 & 0xffffffff,&iov,1,0xffffffffffffffff);
    ppiVar9 = ppiVar17;
    if (iVar1 != 0xd) goto LAB_001555ec;
    if (ppiStack_520 != (int **)0xd) goto LAB_001555f1;
    unaff_R14 = apiStack_578;
    ppiStack_590 = (int **)0x1554d6;
    uv_fs_req_cleanup(unaff_R14);
    ppiStack_590 = (int **)0x1554e9;
    uv_fs_close(loop,unaff_R14,(ulong)ppiVar17 & 0xffffffff,0);
    ppiStack_590 = (int **)0x155502;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001555f6;
    if (ppiStack_520 != (int **)0x0) goto LAB_001555fb;
    ppiVar9 = apiStack_578;
    ppiStack_590 = (int **)0x155523;
    uv_fs_req_cleanup(ppiVar9);
    unaff_R14 = (int **)0x184385;
    ppiStack_590 = (int **)0x155537;
    check_permission("test_file",0x100);
    ppiStack_590 = (int **)0x155546;
    iVar1 = uv_fs_unlink(0,ppiVar9,"test_file",0);
    if (iVar1 != 0) goto LAB_00155600;
    if (ppiStack_520 != (int **)0x0) goto LAB_00155605;
    ppiStack_590 = (int **)0x155567;
    uv_fs_req_cleanup(apiStack_578);
    ppiStack_590 = (int **)0x155575;
    uv_run(loop,0);
    unaff_R14 = (int **)0x184385;
    ppiStack_590 = (int **)0x155591;
    uv_fs_chmod(0,apiStack_578,"test_file",0x180,0);
    ppiStack_590 = (int **)0x155599;
    uv_fs_req_cleanup(apiStack_578);
    ppiStack_590 = (int **)0x1555a1;
    unlink("test_file");
    ppiStack_590 = (int **)0x1555a6;
    ppiVar9 = (int **)uv_default_loop();
    ppiStack_590 = (int **)0x1555ba;
    uv_walk(ppiVar9,close_walk_cb,0);
    ppiStack_590 = (int **)0x1555c4;
    uv_run(ppiVar9,0);
    ppiStack_590 = (int **)0x1555c9;
    uVar4 = uv_default_loop();
    ppiStack_590 = (int **)0x1555d1;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  ppiStack_590 = (int **)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  ppiVar14 = apiStack_750;
  ppiVar15 = apiStack_750;
  ppiVar16 = apiStack_750;
  ppiVar17 = apiStack_750;
  puVar10 = (uv_loop_t *)0x184385;
  pcStack_758 = (code *)0x155628;
  ppiStack_598 = ppiVar9;
  ppiStack_590 = unaff_R14;
  unlink("test_file");
  pcStack_758 = (code *)0x155634;
  unlink("test_file_link");
  pcStack_758 = (code *)0x155639;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_758 = (code *)0x15565b;
  iVar1 = uv_fs_open(0,apiStack_750,"test_file",0x42,0x180,0);
  puVar3 = puStack_6f8;
  if (iVar1 < 0) {
    pcStack_758 = (code *)0x15592c;
    run_test_fs_chown_cold_1();
LAB_0015592c:
    pcStack_758 = (code *)0x155931;
    run_test_fs_chown_cold_2();
LAB_00155931:
    pcStack_758 = (code *)0x155936;
    run_test_fs_chown_cold_3();
LAB_00155936:
    ppiVar14 = unaff_R14;
    pcStack_758 = (code *)0x15593b;
    run_test_fs_chown_cold_4();
LAB_0015593b:
    pcStack_758 = (code *)0x155940;
    run_test_fs_chown_cold_5();
LAB_00155940:
    ppiVar15 = ppiVar14;
    pcStack_758 = (code *)0x155945;
    run_test_fs_chown_cold_6();
LAB_00155945:
    pcStack_758 = (code *)0x15594a;
    run_test_fs_chown_cold_7();
LAB_0015594a:
    pcStack_758 = (code *)0x15594f;
    run_test_fs_chown_cold_8();
LAB_0015594f:
    pcStack_758 = (code *)0x155954;
    run_test_fs_chown_cold_9();
LAB_00155954:
    pcStack_758 = (code *)0x155959;
    run_test_fs_chown_cold_10();
LAB_00155959:
    pcStack_758 = (code *)0x15595e;
    run_test_fs_chown_cold_11();
LAB_0015595e:
    pcStack_758 = (code *)0x155963;
    run_test_fs_chown_cold_12();
LAB_00155963:
    pcStack_758 = (code *)0x155968;
    run_test_fs_chown_cold_13();
LAB_00155968:
    ppiVar16 = ppiVar15;
    pcStack_758 = (code *)0x15596d;
    run_test_fs_chown_cold_14();
LAB_0015596d:
    pcStack_758 = (code *)0x155972;
    run_test_fs_chown_cold_15();
LAB_00155972:
    ppiVar17 = ppiVar16;
    pcStack_758 = (code *)0x155977;
    run_test_fs_chown_cold_16();
LAB_00155977:
    pcStack_758 = (code *)0x15597c;
    run_test_fs_chown_cold_17();
LAB_0015597c:
    pcStack_758 = (code *)0x155981;
    run_test_fs_chown_cold_18();
LAB_00155981:
    pcStack_758 = (code *)0x155986;
    run_test_fs_chown_cold_19();
LAB_00155986:
    pcStack_758 = (code *)0x15598b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar10 = puStack_6f8;
    if ((long)puStack_6f8 < 0) goto LAB_0015592c;
    pcStack_758 = (code *)0x15567c;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x15569b;
    iVar1 = uv_fs_chown(0,apiStack_750,"test_file",0xffffffff,0xffffffff,0);
    puVar10 = puVar3;
    unaff_R14 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155931;
    unaff_R14 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155936;
    pcStack_758 = (code *)0x1556ba;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x1556d4;
    iVar1 = uv_fs_fchown(0,apiStack_750,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015593b;
    ppiVar14 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155940;
    pcStack_758 = (code *)0x1556f3;
    uv_fs_req_cleanup(apiStack_750);
    pcStack_758 = (code *)0x15571b;
    puVar5 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_750,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155945;
    pcStack_758 = (code *)0x155731;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar15 = apiStack_750;
    if (chown_cb_count != 1) goto LAB_0015594a;
    chown_cb_count = 0;
    pcStack_758 = (code *)0x15576a;
    puVar5 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_750,"test_file",0,0,chown_root_cb);
    ppiVar15 = apiStack_750;
    if (iVar1 != 0) goto LAB_0015594f;
    pcStack_758 = (code *)0x155780;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar15 = apiStack_750;
    if (chown_cb_count != 1) goto LAB_00155954;
    pcStack_758 = (code *)0x1557b0;
    puVar5 = loop;
    iVar1 = uv_fs_fchown(loop,apiStack_750,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    ppiVar15 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155959;
    pcStack_758 = (code *)0x1557c6;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar15 = apiStack_750;
    if (fchown_cb_count != 1) goto LAB_0015595e;
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x1557ee;
    iVar1 = uv_fs_link(0,apiStack_750,"test_file","test_file_link",0);
    ppiVar15 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155963;
    ppiVar15 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155968;
    pcStack_758 = (code *)0x15580d;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x15582c;
    iVar1 = uv_fs_lchown(0,apiStack_750,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015596d;
    ppiVar16 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155972;
    pcStack_758 = (code *)0x15584b;
    uv_fs_req_cleanup(apiStack_750);
    pcStack_758 = (code *)0x155873;
    puVar5 = loop;
    iVar1 = uv_fs_lchown(loop,apiStack_750,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_00155977;
    pcStack_758 = (code *)0x155889;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar17 = apiStack_750;
    if (lchown_cb_count != 1) goto LAB_0015597c;
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x1558a4;
    iVar1 = uv_fs_close(0,apiStack_750,(ulong)puVar3 & 0xffffffff,0);
    ppiVar17 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155981;
    ppiVar17 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155986;
    pcStack_758 = (code *)0x1558c0;
    uv_fs_req_cleanup(apiStack_750);
    pcStack_758 = (code *)0x1558ce;
    uv_run(loop,0);
    pcStack_758 = (code *)0x1558da;
    unlink("test_file");
    pcStack_758 = (code *)0x1558e6;
    unlink("test_file_link");
    pcStack_758 = (code *)0x1558eb;
    puVar10 = (uv_loop_t *)uv_default_loop();
    pcStack_758 = (code *)0x1558ff;
    uv_walk(puVar10,close_walk_cb,0);
    pcStack_758 = (code *)0x155909;
    uv_run(puVar10,0);
    pcStack_758 = (code *)0x15590e;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_758 = (code *)0x155916;
    iVar1 = uv_loop_close();
    ppiVar17 = apiStack_750;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_758 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar5->backend_fd == 0x1a) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    puStack_760 = (uv_loop_t *)0x1559af;
    chown_cb_cold_1();
  }
  puStack_760 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_760 = puVar10;
  if (puVar5->backend_fd == 0x1a) {
    pcStack_768 = (code *)0x1559c3;
    puVar3 = puVar5;
    _Var2 = geteuid();
    pvVar6 = puVar5->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar6 == (void *)0xffffffffffffffff) goto LAB_001559db;
      pcStack_768 = (code *)0x1559d6;
      chown_root_cb_cold_2();
    }
    puVar10 = puVar5;
    if (pvVar6 == (void *)0x0) {
LAB_001559db:
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(puVar5);
      return iVar1;
    }
  }
  else {
    pcStack_768 = (code *)0x1559ef;
    chown_root_cb_cold_1();
    puVar3 = puVar5;
  }
  pcStack_768 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar3->backend_fd == 0x1b) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_770 = (code *)0x155a13;
    fchown_cb_cold_1();
  }
  pcStack_770 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar3->backend_fd == 0x1e) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    ppiStack_778 = (int **)0x155a37;
    lchown_cb_cold_1();
  }
  ppiStack_778 = (int **)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar7 = "test_file";
  pcStack_950 = (code *)0x155a55;
  puStack_780 = puVar10;
  ppiStack_778 = ppiVar17;
  unlink("test_file");
  pcStack_950 = (code *)0x155a61;
  unlink("test_file_link");
  pcStack_950 = (code *)0x155a6d;
  unlink("test_file_link2");
  pcStack_950 = (code *)0x155a72;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar13 = (char *)0x0;
  pcStack_950 = (code *)0x155a96;
  iVar1 = uv_fs_open(0,acStack_938,"test_file",0x42,0x180,0);
  pcVar11 = pcStack_8e0;
  if (iVar1 < 0) {
    pcStack_950 = (code *)0x155dd4;
    run_test_fs_link_cold_1();
LAB_00155dd4:
    pcStack_950 = (code *)0x155dd9;
    run_test_fs_link_cold_2();
LAB_00155dd9:
    pcStack_950 = (code *)0x155dde;
    run_test_fs_link_cold_3();
LAB_00155dde:
    pcStack_950 = (code *)0x155de3;
    run_test_fs_link_cold_4();
LAB_00155de3:
    pcStack_950 = (code *)0x155de8;
    run_test_fs_link_cold_5();
LAB_00155de8:
    pcStack_950 = (code *)0x155ded;
    run_test_fs_link_cold_6();
LAB_00155ded:
    pcVar11 = pcVar7;
    pcStack_950 = (code *)0x155df2;
    run_test_fs_link_cold_7();
LAB_00155df2:
    pcStack_950 = (code *)0x155df7;
    run_test_fs_link_cold_8();
LAB_00155df7:
    pcStack_950 = (code *)0x155dfc;
    run_test_fs_link_cold_9();
LAB_00155dfc:
    pcStack_950 = (code *)0x155e01;
    run_test_fs_link_cold_10();
LAB_00155e01:
    pcStack_950 = (code *)0x155e06;
    run_test_fs_link_cold_11();
LAB_00155e06:
    pcStack_950 = (code *)0x155e0b;
    run_test_fs_link_cold_12();
LAB_00155e0b:
    pcStack_950 = (code *)0x155e10;
    run_test_fs_link_cold_13();
LAB_00155e10:
    pcVar7 = pcVar11;
    pcStack_950 = (code *)0x155e15;
    run_test_fs_link_cold_14();
LAB_00155e15:
    pcStack_950 = (code *)0x155e1a;
    run_test_fs_link_cold_15();
LAB_00155e1a:
    pcStack_950 = (code *)0x155e1f;
    run_test_fs_link_cold_16();
LAB_00155e1f:
    pcStack_950 = (code *)0x155e24;
    run_test_fs_link_cold_17();
LAB_00155e24:
    pcStack_950 = (code *)0x155e29;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar7 = pcStack_8e0;
    if ((long)pcStack_8e0 < 0) goto LAB_00155dd4;
    pcStack_950 = (code *)0x155ab9;
    uv_fs_req_cleanup(acStack_938);
    pcStack_950 = (code *)0x155aca;
    uVar18 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_948 = 0;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155b00;
    iov = uVar18;
    iVar1 = uv_fs_write(0,acStack_938,(ulong)pcVar11 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar11;
    if (iVar1 != 0xd) goto LAB_00155dd9;
    if (pcStack_8e0 != (char *)0xd) goto LAB_00155dde;
    pcStack_950 = (code *)0x155b22;
    uv_fs_req_cleanup(acStack_938);
    pcStack_950 = (code *)0x155b35;
    uv_fs_close(loop,acStack_938,(ulong)pcVar11 & 0xffffffff,0);
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155b50;
    iVar1 = uv_fs_link(0,acStack_938,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155de3;
    if (pcStack_8e0 != (char *)0x0) goto LAB_00155de8;
    pcStack_950 = (code *)0x155b71;
    uv_fs_req_cleanup();
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155b8d;
    iVar1 = uv_fs_open(0,acStack_938,"test_file_link",2,0,0);
    pcVar11 = pcStack_8e0;
    pcVar7 = acStack_938;
    if (iVar1 < 0) goto LAB_00155ded;
    if ((long)pcStack_8e0 < 0) goto LAB_00155df2;
    pcStack_950 = (code *)0x155bb0;
    uv_fs_req_cleanup(acStack_938);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_950 = (code *)0x155bd2;
    uVar18 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_948 = 0;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155c04;
    iov = uVar18;
    iVar1 = uv_fs_read(0,acStack_938,(ulong)pcVar11 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155df7;
    if ((long)pcStack_8e0 < 0) goto LAB_00155dfc;
    pcVar13 = buf;
    pcStack_950 = (code *)0x155c2b;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e01;
    pcStack_950 = (code *)0x155c3a;
    close((int)pcVar11);
    pcStack_950 = (code *)0x155c60;
    pcVar13 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_938,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155e06;
    pcStack_950 = (code *)0x155c76;
    pcVar13 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155e0b;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155ca1;
    iVar1 = uv_fs_open(0,acStack_938,"test_file_link2",2,0,0);
    pcVar7 = pcStack_8e0;
    if (iVar1 < 0) goto LAB_00155e10;
    if ((long)pcStack_8e0 < 0) goto LAB_00155e15;
    pcStack_950 = (code *)0x155cc4;
    uv_fs_req_cleanup(acStack_938);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_950 = (code *)0x155ce6;
    uVar18 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_948 = 0;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155d18;
    iov = uVar18;
    iVar1 = uv_fs_read(0,acStack_938,(ulong)pcVar7 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155e1a;
    if ((long)pcStack_8e0 < 0) goto LAB_00155e1f;
    pcVar13 = buf;
    pcStack_950 = (code *)0x155d3f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e24;
    pcStack_950 = (code *)0x155d5c;
    uv_fs_close(loop,acStack_938,(ulong)pcVar7 & 0xffffffff,0);
    pcStack_950 = (code *)0x155d6a;
    uv_run(loop,0);
    pcStack_950 = (code *)0x155d76;
    unlink("test_file");
    pcStack_950 = (code *)0x155d82;
    unlink("test_file_link");
    pcStack_950 = (code *)0x155d8e;
    unlink("test_file_link2");
    pcStack_950 = (code *)0x155d93;
    pcVar7 = (char *)uv_default_loop();
    pcStack_950 = (code *)0x155da7;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_950 = (code *)0x155db1;
    uv_run(pcVar7,0);
    pcStack_950 = (code *)0x155db6;
    pcVar13 = (char *)uv_default_loop();
    pcStack_950 = (code *)0x155dbe;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_950 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar13)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar13)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_958 = (code *)0x155e4d;
    link_cb_cold_1();
  }
  pcStack_958 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_958 = (code *)pcVar7;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_b10,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155f47;
    if (dummy_cb_count != 1) goto LAB_00155f4c;
    if (lStack_ab0 != 0) goto LAB_00155f51;
    if (lStack_ab8 != -2) goto LAB_00155f56;
    uv_fs_req_cleanup(auStack_b10);
    iVar1 = uv_fs_readlink(0,auStack_b10,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155f5b;
    if (lStack_ab0 != 0) goto LAB_00155f60;
    if (lStack_ab8 == -2) {
      uv_fs_req_cleanup(auStack_b10);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00155f6a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155f47:
    run_test_fs_readlink_cold_2();
LAB_00155f4c:
    run_test_fs_readlink_cold_3();
LAB_00155f51:
    run_test_fs_readlink_cold_4();
LAB_00155f56:
    run_test_fs_readlink_cold_5();
LAB_00155f5b:
    run_test_fs_readlink_cold_6();
LAB_00155f60:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155f6a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(fs_chmod) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  /* Make the file write-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0200, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0200);
#endif

  /* Make the file read-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0400, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0400);

  /* Make the file read+write with sync uv_fs_fchmod */
  r = uv_fs_fchmod(NULL, &req, file, 0600, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0600);

#ifndef _WIN32
  /* async chmod */
  {
    static int mode = 0200;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0200, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);
  chmod_cb_count = 0; /* reset for the next test */
#endif

  /* async chmod */
  {
    static int mode = 0400;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0400, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);

  /* async fchmod */
  {
    static int mode = 0600;
    req.data = &mode;
  }
  r = uv_fs_fchmod(loop, &req, file, 0600, fchmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchmod_cb_count == 1);

  uv_fs_close(loop, &req, file, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}